

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

void __thiscall
nv::FloatImage::applyKernelVertical
          (FloatImage *this,PolyphaseKernel *k,int x,uint c,uint a,WrapMode wm,float *output)

{
  ulong uVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  float *pfVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  uint uVar19;
  
  uVar12 = (ulong)k->m_length;
  if (uVar12 != 0) {
    uVar6 = k->m_windowSize;
    uVar3 = this->m_height;
    iVar14 = (uint)this->m_width * (uint)uVar3;
    fVar2 = k->m_width;
    pfVar7 = this->m_mem;
    uVar15 = 0;
    if (0 < x) {
      uVar15 = x;
    }
    uVar20 = 0;
    do {
      fVar22 = ((float)(uVar20 & 0xffffffff) + 0.5) * (1.0 / ((float)uVar12 / (float)uVar3));
      fVar23 = floorf(fVar22 - fVar2);
      fVar22 = ceilf(fVar22 + fVar2);
      if (((int)uVar6 < (int)fVar22 - (int)fVar23) &&
         (iVar10 = nvAbort("right - left <= windowSize",
                           "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                           ,0x348,
                           "void nv::FloatImage::applyKernelVertical(const PolyphaseKernel &, int, uint, uint, WrapMode, float *__restrict) const"
                          ), iVar10 == 1)) {
        raise(5);
      }
      fVar22 = NAN;
      if (0 < (int)uVar6) {
        uVar4 = this->m_height;
        uVar5 = this->m_width;
        uVar8 = uVar5 - 1;
        if (uVar15 < uVar5) {
          uVar8 = uVar15;
        }
        uVar11 = x;
        if (uVar5 == 1) {
          uVar11 = 0;
        }
        uVar9 = -uVar11;
        if (0 < (int)uVar11) {
          uVar9 = uVar11;
        }
        fVar22 = 0.0;
        uVar21 = 0;
        fVar24 = 0.0;
        do {
          uVar1 = uVar21 + (long)(int)fVar23;
          uVar18 = (uint)uVar5;
          uVar19 = (uint)uVar5;
          uVar11 = (uint)uVar1;
          uVar17 = (uint)uVar4;
          if (wm == WrapMode_Repeat) {
            if ((long)uVar1 < 0) {
              uVar13 = ~(~uVar11 % (uint)uVar4) + uVar17;
            }
            else {
              uVar13 = (uint)((uVar1 & 0xffffffff) % (ulong)uVar4);
            }
            if (x < 0) {
              uVar16 = ~((uint)~x % uVar19) + uVar19;
            }
            else {
              uVar16 = (uint)x % uVar18;
            }
LAB_001c6e62:
            iVar10 = uVar13 * uVar19 + uVar16;
          }
          else {
            uVar16 = uVar9;
            if (wm != WrapMode_Clamp) {
              while (uVar18 <= uVar16) {
                uVar13 = ((uVar5 - 2) + (uint)uVar5) - uVar16;
                uVar16 = -uVar13;
                if (0 < (int)uVar13) {
                  uVar16 = uVar13;
                }
              }
              if (uVar17 == 1) {
                uVar11 = 0;
              }
              uVar13 = -uVar11;
              if (0 < (int)uVar11) {
                uVar13 = uVar11;
              }
              while (uVar17 <= uVar13) {
                uVar11 = ((uVar4 - 2) + (uint)uVar4) - uVar13;
                uVar13 = -uVar11;
                if (0 < (int)uVar11) {
                  uVar13 = uVar11;
                }
              }
              goto LAB_001c6e62;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if (uVar17 <= uVar11) {
              uVar11 = uVar4 - 1;
            }
            iVar10 = uVar11 * uVar18 + uVar8;
          }
          fVar25 = (pfVar7[(ulong)(iVar14 * a) + (long)iVar10] + 0.00390625) *
                   k->m_data[(uint)((int)uVar21 + k->m_windowSize * (int)uVar20)];
          fVar24 = fVar24 + fVar25;
          fVar22 = fVar22 + fVar25 * pfVar7[(ulong)(c * iVar14) + (long)iVar10];
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar6);
        fVar22 = fVar22 / fVar24;
      }
      output[uVar20] = fVar22;
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar12);
  }
  return;
}

Assistant:

void FloatImage::applyKernelVertical(const PolyphaseKernel & k, int x, uint c, uint a, WrapMode wm, float * __restrict output) const
{
	const uint length = k.length();
	const float scale = float(length) / float(m_height);
	const float iscale = 1.0f / scale;

	const float width = k.width();
	const int windowSize = k.windowSize();

	const float * channel = this->channel(c);
	const float * alpha = this->channel(a);

	for (uint i = 0; i < length; i++)
	{
		const float center = (0.5f + i) * iscale;
		
		const int left = (int)floorf(center - width);
		const int right = (int)ceilf(center + width);
		nvCheck(right - left <= windowSize);
		
		float norm = 0;
		float sum = 0;
		for (int j = 0; j < windowSize; ++j)
		{
			const int idx = this->index(x, j+left, wm);
			
			float w = k.valueAt(i, j) * (alpha[idx] + (1.0f / 256.0f));
			norm += w;
			sum += w * channel[idx];
		}
		
		output[i] = sum / norm;
	}
}